

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

Layer * ncnn::create_layer(char *type)

{
  int index_00;
  int index;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined8 local_8;
  
  index_00 = layer_to_index((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (index_00 == -1) {
    local_8 = (Layer *)0x0;
  }
  else {
    local_8 = create_layer(index_00);
  }
  return local_8;
}

Assistant:

Layer* create_layer(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer(index);
}